

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_status_t
linear_hash_insert(ion_key_t key,ion_value_t value,int hash_bucket_idx,
                  linear_hash_table_t *linear_hash)

{
  ion_value_t __src;
  byte bVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  long record_loc;
  long bucket_loc;
  size_t __n_00;
  ion_fpos_t *overflow_loc;
  ion_byte_t *key_00;
  ulong uVar4;
  ion_byte_t *value_00;
  ion_byte_t aiStack_70 [8];
  ion_fpos_t iStack_68;
  long lStack_60;
  ion_byte_t aiStack_58 [8];
  ion_value_t local_50;
  linear_hash_bucket_t local_48;
  ion_byte_t local_31 [8];
  ion_byte_t record_status;
  
  local_50 = value;
  if (hash_bucket_idx < linear_hash->next_split) {
    lStack_60 = 0x10bbf4;
    hash_bucket_idx = hash_to_bucket((ion_byte_t *)key,linear_hash);
  }
  __n = (size_t)(linear_hash->super).record.key_size;
  key_00 = aiStack_58 + -(__n + 0xf & 0xfffffffffffffff0);
  __n_00 = (size_t)(linear_hash->super).record.value_size;
  value_00 = key_00 + -(__n_00 + 0xf & 0xfffffffffffffff0);
  local_31[0] = '\x01';
  value_00[-8] = '0';
  value_00[-7] = 0xbc;
  value_00[-6] = '\x10';
  value_00[-5] = '\0';
  value_00[-4] = '\0';
  value_00[-3] = '\0';
  value_00[-2] = '\0';
  value_00[-1] = '\0';
  memcpy(key_00,key,__n);
  __src = local_50;
  value_00[-8] = '?';
  value_00[-7] = 0xbc;
  value_00[-6] = '\x10';
  value_00[-5] = '\0';
  value_00[-4] = '\0';
  value_00[-3] = '\0';
  value_00[-2] = '\0';
  value_00[-1] = '\0';
  memcpy(value_00,__src,__n_00);
  if (hash_bucket_idx < linear_hash->bucket_map->current_size) {
    bucket_loc = linear_hash->bucket_map->data[hash_bucket_idx];
  }
  else {
    value_00[-8] = 0xff;
    value_00[-7] = 0xff;
    value_00[-6] = 0xff;
    value_00[-5] = 0xff;
    value_00[-4] = 0xff;
    value_00[-3] = 0xff;
    value_00[-2] = 0xff;
    value_00[-1] = 0xff;
    bucket_loc = *(long *)(value_00 + -8);
  }
  value_00[-8] = 'h';
  value_00[-7] = 0xbc;
  value_00[-6] = '\x10';
  value_00[-5] = '\0';
  value_00[-4] = '\0';
  value_00[-3] = '\0';
  value_00[-2] = '\0';
  value_00[-1] = '\0';
  bVar1 = linear_hash_get_bucket(bucket_loc,&local_48,linear_hash);
  if (bVar1 == 0) {
    record_loc = bucket_loc + 0x10;
    lVar2 = (long)local_48.record_count;
    value_00[-8] = '\x01';
    value_00[-7] = '\0';
    value_00[-6] = '\0';
    value_00[-5] = '\0';
    value_00[-4] = '\0';
    value_00[-3] = '\0';
    value_00[-2] = '\0';
    value_00[-1] = '\0';
    iVar3 = (int)*(undefined8 *)(value_00 + -8);
    overflow_loc = (ion_fpos_t *)value_00;
    if (lVar2 != 0) {
      if (linear_hash->records_per_bucket == local_48.record_count) {
        overflow_loc = (ion_fpos_t *)(value_00 + -0x10);
        value_00[-0x18] = 0xa5;
        value_00[-0x17] = 0xbc;
        value_00[-0x16] = '\x10';
        value_00[-0x15] = '\0';
        value_00[-0x14] = '\0';
        value_00[-0x13] = '\0';
        value_00[-0x12] = '\0';
        value_00[-0x11] = '\0';
        bVar1 = create_overflow_bucket(local_48.idx,overflow_loc,linear_hash);
        if (bVar1 != 0) goto LAB_0010bcdf;
        local_48.overflow_location = bucket_loc;
        bucket_loc = *overflow_loc;
        record_loc = bucket_loc + 0x10;
        value_00[-0x18] = '\x01';
        value_00[-0x17] = '\0';
        value_00[-0x16] = '\0';
        value_00[-0x15] = '\0';
        value_00[-0x14] = '\0';
        value_00[-0x13] = '\0';
        value_00[-0x12] = '\0';
        value_00[-0x11] = '\0';
        iVar3 = (int)*(undefined8 *)(value_00 + -0x18);
      }
      else {
        record_loc = record_loc + lVar2 * linear_hash->record_total_size;
        iVar3 = local_48.record_count + 1;
      }
    }
    overflow_loc[-1] = 0x10bcdb;
    bVar1 = linear_hash_write_record(record_loc,key_00,value_00,local_31,linear_hash);
    if (bVar1 == 0) {
      uVar4 = 0x100000000;
      local_48.record_count = iVar3;
      overflow_loc[-1] = 0x10bd14;
      bVar1 = linear_hash_update_bucket(bucket_loc,&local_48,linear_hash);
      if (bVar1 == 0) {
        overflow_loc[-1] = 0x10bd20;
        linear_hash_increment_num_records(linear_hash);
        bVar1 = 0;
      }
      goto LAB_0010bce2;
    }
  }
LAB_0010bcdf:
  uVar4 = 0;
LAB_0010bce2:
  return (ion_status_t)(bVar1 | uVar4);
}

Assistant:

ion_status_t
linear_hash_insert(
	ion_key_t			key,
	ion_value_t			value,
	int					hash_bucket_idx,
	linear_hash_table_t *linear_hash
) {
	ion_status_t status = ION_STATUS_INITIALIZE;

	if (hash_bucket_idx < linear_hash->next_split) {
		hash_bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_full;

	memcpy(record_key, key, linear_hash->super.record.key_size);
	memcpy(record_value, value, linear_hash->super.record.value_size);

	/* get the appropriate bucket for insertion */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(hash_bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* location of the records in the bucket to be stored in */
	ion_fpos_t	bucket_records_loc = GET_BUCKET_RECORDS_LOC(bucket_loc);
	ion_fpos_t	record_loc;

	/* Case the bucket is empty */
	if (bucket.record_count == 0) {
		record_loc = bucket_records_loc;
	}
	else {
		/* Case that the bucket is full but there is not yet an overflow bucket */
		if (linear_hash_bucket_is_full(bucket, linear_hash)) {
			/* Get location of overflow bucket and update the tail record for the linked list of buckets storing
			 * items that hash to this bucket and update the tail bucket with the overflow's location */
			ion_fpos_t *overflow_location = alloca(sizeof(ion_fpos_t));

			status.error = create_overflow_bucket(bucket.idx, overflow_location, linear_hash);

			if (err_ok != status.error) {
				return status;
			}

			/* update parameters of bucket to match that of overflow just created */
			bucket.record_count			= 0;
			bucket.overflow_location	= bucket_loc;

			/* update the locations to write to in the file for the record and bucket */
			record_loc					= GET_BUCKET_RECORDS_LOC(*overflow_location);
			bucket_loc					= *overflow_location;
		}
		/* case there is >= 1 record in the bucket but it is not full */
		else {
			/* create a linear_hash_record with the desired key, value, and status of full*/
			record_loc = bucket_loc + sizeof(linear_hash_bucket_t) + bucket.record_count * linear_hash->record_total_size;
		}
	}

	/* write new record to the db */
	status.error = linear_hash_write_record(record_loc, record_key, record_value, &record_status, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	status.count++;

	/* update bucket */
	bucket.record_count++;
	status.error = linear_hash_update_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	status.error = err_ok;
	linear_hash_increment_num_records(linear_hash);
	return status;
}